

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.cc
# Opt level: O0

void __thiscall
prometheus::Summary::Summary
          (Summary *this,Quantiles *quantiles,milliseconds max_age,int age_buckets)

{
  duration local_30;
  int local_24;
  Quantiles *pQStack_20;
  int age_buckets_local;
  Quantiles *quantiles_local;
  Summary *this_local;
  milliseconds max_age_local;
  
  local_24 = age_buckets;
  pQStack_20 = quantiles;
  quantiles_local = &this->quantiles_;
  this_local = (Summary *)max_age.__r;
  std::
  vector<prometheus::detail::CKMSQuantiles::Quantile,_std::allocator<prometheus::detail::CKMSQuantiles::Quantile>_>
  ::vector(&this->quantiles_,quantiles);
  std::mutex::mutex(&this->mutex_);
  this->count_ = 0;
  this->sum_ = 0.0;
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_30,
             (duration<long,_std::ratio<1L,_1000L>_> *)&this_local);
  detail::TimeWindowQuantiles::TimeWindowQuantiles
            (&this->quantile_values_,&this->quantiles_,local_30,local_24);
  return;
}

Assistant:

Summary::Summary(Quantiles&& quantiles, const std::chrono::milliseconds max_age,
                 const int age_buckets)
    : quantiles_{std::move(quantiles)},
      quantile_values_{quantiles_, max_age, age_buckets} {}